

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

enable_if_t<HasSize<vector<LightBVHNode>_>::value_&&_HasData<vector<LightBVHNode>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *v)

{
  ulong uVar1;
  ulong uVar2;
  LightBVHNode *this;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  if (v->nStored != 0) {
    this = v->ptr;
    uVar2 = 0;
    do {
      LightBVHNode::ToString_abi_cxx11_(&local_50,this);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar1 = v->nStored;
      if (uVar2 < uVar1 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        uVar1 = v->nStored;
      }
      uVar2 = uVar2 + 1;
      this = this + 1;
    } while (uVar2 < uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}